

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O3

int ARKodeResStolerance(void *arkode_mem,sunrealtype rabstol)

{
  int iVar1;
  int iVar2;
  int error_code;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    iVar2 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    iVar1 = 0x1a5;
  }
  else if (*(int *)((long)arkode_mem + 0x1e8) == 0) {
    msgfmt = "time-stepping module does not support non-identity mass matrices";
    iVar2 = -0x30;
    error_code = -0x30;
    iVar1 = 0x1ae;
  }
  else if (*(int *)((long)arkode_mem + 0x388) == 0) {
    msgfmt = "Attempt to call before ARKodeInit.";
    iVar2 = -0x17;
    error_code = -0x17;
    iVar1 = 0x1b6;
  }
  else {
    if (0.0 <= rabstol) {
      *(uint *)((long)arkode_mem + 0x50) = -(uint)(rabstol == 0.0) & 1;
      if (*(int *)((long)arkode_mem + 0x220) != 0) {
        *(undefined8 *)((long)arkode_mem + 0x218) = 0;
        iVar1 = arkAllocVec((ARKodeMem)arkode_mem,*(N_Vector *)((long)arkode_mem + 0x210),
                            (N_Vector *)((long)arkode_mem + 0x218));
        if (iVar1 == 0) {
          arkProcessError((ARKodeMem)arkode_mem,-0x14,0x1ca,"ARKodeResStolerance",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                          ,"Allocation of arkode_mem failed.");
          return -0x16;
        }
        *(undefined4 *)((long)arkode_mem + 0x220) = 0;
      }
      *(sunrealtype *)((long)arkode_mem + 0x40) = rabstol;
      *(undefined4 *)((long)arkode_mem + 0x1c) = 0;
      *(undefined4 *)((long)arkode_mem + 0x54) = 0;
      *(code **)((long)arkode_mem + 0x70) = arkRwtSet;
      *(void **)((long)arkode_mem + 0x78) = arkode_mem;
      return 0;
    }
    msgfmt = "rabstol has negative component(s) (illegal).";
    iVar2 = -0x16;
    error_code = -0x16;
    iVar1 = 0x1bc;
  }
  arkProcessError((ARKodeMem)arkode_mem,error_code,iVar1,"ARKodeResStolerance",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                  ,msgfmt);
  return iVar2;
}

Assistant:

int ARKodeResStolerance(void* arkode_mem, sunrealtype rabstol)
{
  /* unpack ark_mem */
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for time steppers that do not support mass matrices */
  if (!ark_mem->step_supports_massmatrix)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support non-identity mass matrices");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* Check inputs */
  if (ark_mem->MallocDone == SUNFALSE)
  {
    arkProcessError(ark_mem, ARK_NO_MALLOC, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MALLOC);
    return (ARK_NO_MALLOC);
  }
  if (rabstol < ZERO)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_BAD_RABSTOL);
    return (ARK_ILL_INPUT);
  }

  /* Set flag indicating whether rabstol == 0 */
  ark_mem->Ratolmin0 = (rabstol == ZERO);

  /* Allocate space for rwt if necessary */
  if (ark_mem->rwt_is_ewt)
  {
    ark_mem->rwt = NULL;
    if (!arkAllocVec(ark_mem, ark_mem->ewt, &(ark_mem->rwt)))
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      MSG_ARK_ARKMEM_FAIL);
      return (ARK_ILL_INPUT);
    }
    ark_mem->rwt_is_ewt = SUNFALSE;
  }

  /* Copy tolerances into memory */
  ark_mem->SRabstol = rabstol;
  ark_mem->ritol    = ARK_SS;

  /* enforce use of arkRwtSet */
  ark_mem->user_efun = SUNFALSE;
  ark_mem->rfun      = arkRwtSet;
  ark_mem->r_data    = ark_mem;

  return (ARK_SUCCESS);
}